

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_impl.cc
# Opt level: O1

void __thiscall QuickImpl::QuickImpl(QuickImpl *this,uint16_t port,bool as_server,QuickCallback *cb)

{
  TaskQueue *this_00;
  TaskQueueFactory *pTVar1;
  TaskQueueBase *task_queue;
  RepeatingTaskBase *this_01;
  pointer *__ptr_2;
  pointer __p;
  pointer *__ptr_1;
  _Head_base<0UL,_dd::TaskQueueBase_*,_false> local_80;
  RepeatingTaskBase *local_78;
  _Head_base<0UL,_dd::QueuedTask_*,_false> local_70 [2];
  QueuedTask local_60 [2];
  unique_ptr<dd::TaskQueueFactory,_std::default_delete<dd::TaskQueueFactory>_> *local_50;
  RepeatingTaskHandle local_38;
  
  (this->super_Quick)._vptr_Quick = (_func_int **)&PTR_ConnectToServer_0012f888;
  local_50 = &this->_task_queue_factory;
  dd::CreateTaskQueueFactory();
  pTVar1 = (this->_task_queue_factory)._M_t.
           super___uniq_ptr_impl<dd::TaskQueueFactory,_std::default_delete<dd::TaskQueueFactory>_>.
           _M_t.
           super__Tuple_impl<0UL,_dd::TaskQueueFactory_*,_std::default_delete<dd::TaskQueueFactory>_>
           .super__Head_base<0UL,_dd::TaskQueueFactory_*,_false>._M_head_impl;
  local_70[0]._M_head_impl = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"quick","");
  (*pTVar1->_vptr_TaskQueueFactory[2])(&local_80,pTVar1,local_70,0);
  this_00 = &this->_task_queue;
  dd::TaskQueue::TaskQueue(this_00,(unique_ptr<dd::TaskQueueBase,_dd::TaskQueueDeleter> *)&local_80)
  ;
  if (local_80._M_head_impl != (TaskQueueBase *)0x0) {
    (**(local_80._M_head_impl)->_vptr_TaskQueueBase)();
  }
  local_80._M_head_impl = (TaskQueueBase *)0x0;
  if (local_70[0]._M_head_impl != local_60) {
    operator_delete(local_70[0]._M_head_impl,(long)local_60[0]._vptr_QueuedTask + 1);
  }
  (this->_repeating_task)._repeating_task = (RepeatingTaskBase *)0x0;
  (this->_paced_thread)._M_t.
  super___uniq_ptr_impl<dd::ProcessThread,_std::default_delete<dd::ProcessThread>_>._M_t.
  super__Tuple_impl<0UL,_dd::ProcessThread_*,_std::default_delete<dd::ProcessThread>_>.
  super__Head_base<0UL,_dd::ProcessThread_*,_false>._M_head_impl = (ProcessThread *)0x0;
  this->_local_port = port;
  this->_as_server = as_server;
  (this->_packet_reader)._M_t.
  super___uniq_ptr_impl<PacketReader,_std::default_delete<PacketReader>_>._M_t.
  super__Tuple_impl<0UL,_PacketReader_*,_std::default_delete<PacketReader>_>.
  super__Head_base<0UL,_PacketReader_*,_false>._M_head_impl = (PacketReader *)0x0;
  (this->_udp_socket)._M_t.super___uniq_ptr_impl<UdpSocket,_std::default_delete<UdpSocket>_>._M_t.
  super__Tuple_impl<0UL,_UdpSocket_*,_std::default_delete<UdpSocket>_>.
  super__Head_base<0UL,_UdpSocket_*,_false>._M_head_impl = (UdpSocket *)0x0;
  (this->_connections)._M_h._M_buckets = &(this->_connections)._M_h._M_single_bucket;
  (this->_connections)._M_h._M_bucket_count = 1;
  (this->_connections)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_connections)._M_h._M_element_count = 0;
  (this->_connections)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_connections)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_connections)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->_quick_cb = cb;
  pthread_mutex_init((pthread_mutex_t *)&this->_quick_lock,(pthread_mutexattr_t *)0x0);
  this->_received_time_microseconds = 0;
  (this->_ack_thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>.
  _M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  (this->_ack_thread_impl)._M_t.super___uniq_ptr_impl<AckThread,_std::default_delete<AckThread>_>.
  _M_t.super__Tuple_impl<0UL,_AckThread_*,_std::default_delete<AckThread>_>.
  super__Head_base<0UL,_AckThread_*,_false>._M_head_impl = (AckThread *)0x0;
  this->_recv_speed_bytes = 0;
  this->_print_time_ms = 0;
  LogWrapper::Load();
  LogWrapper::Open(&g_quic_log,"quic");
  InitQuck(this);
  local_70[0]._M_head_impl = (QueuedTask *)operator_new(0x10);
  (local_70[0]._M_head_impl)->_vptr_QueuedTask = (_func_int **)&PTR__QueuedTask_0012f8d0;
  local_70[0]._M_head_impl[1]._vptr_QueuedTask = (_func_int **)this;
  dd::TaskQueue::PostTask
            (this_00,(unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *)local_70);
  if (local_70[0]._M_head_impl != (QueuedTask *)0x0) {
    (*(local_70[0]._M_head_impl)->_vptr_QueuedTask[1])();
  }
  task_queue = this_00->_impl;
  this_01 = (RepeatingTaskBase *)operator_new(0x20);
  dd::RepeatingTaskBase::RepeatingTaskBase(this_01,task_queue,1000);
  (this_01->super_QueuedTask)._vptr_QueuedTask = (_func_int **)&PTR__RepeatingTaskBase_0012f910;
  this_01[1].super_QueuedTask._vptr_QueuedTask = (_func_int **)this;
  local_70[0]._M_head_impl = (QueuedTask *)0x0;
  local_78 = this_01;
  (*task_queue->_vptr_TaskQueueBase[2])(task_queue,&local_78,1000);
  if (local_78 != (RepeatingTaskBase *)0x0) {
    (*(local_78->super_QueuedTask)._vptr_QueuedTask[1])();
  }
  local_78 = (RepeatingTaskBase *)0x0;
  dd::RepeatingTaskHandle::RepeatingTaskHandle(&local_38,this_01);
  std::
  unique_ptr<dd::RepeatingTaskImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc:26:83)>,_std::default_delete<dd::RepeatingTaskImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc:26:83)>_>_>
  ::~unique_ptr((unique_ptr<dd::RepeatingTaskImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_boss_li[P]quick_quick_quick_impl_cc:26:83)>,_std::default_delete<dd::RepeatingTaskImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_boss_li[P]quick_quick_quick_impl_cc:26:83)>_>_>
                 *)local_70);
  dd::RepeatingTaskHandle::operator=(&this->_repeating_task,&local_38);
  return;
}

Assistant:

QuickImpl::QuickImpl(uint16_t port, bool as_server, QuickCallback* cb)
	: _local_port(port), _as_server(as_server), _task_queue_factory(CreateTaskQueueFactory()),
	_task_queue(_task_queue_factory->CreateTaskQueue("quick", TaskQueueFactory::Priority::NORMAL)),
	_quick_cb(cb)
{
	LogWrapper::Load();
	g_quic_log.Open("quic");
	InitQuck();
	_task_queue.PostTask([this]() {
		_paced_thread = ProcessThread::Create("paced_sender");
		_paced_thread->Start();
	});

	_repeating_task = dd::RepeatingTaskHandle::DelayedStart(_task_queue.Get(), 1000, [this] {
		CheckTimeout();
		return 1000;
	});
}